

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsnew3(prscxdef *ctx,int t,prsndef *n1,prsndef *n2,prsndef *n3)

{
  prsndef *ppVar1;
  long in_RCX;
  prsndef *in_RDX;
  int in_ESI;
  prsndef *in_R8;
  prsndef *n;
  int in_stack_ffffffffffffffcc;
  prscxdef *in_stack_ffffffffffffffd0;
  
  ppVar1 = prsalo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  ppVar1->prsntyp = in_ESI;
  ppVar1->prsnnlf = 3;
  (ppVar1->prsnv).prsnvn[0] = in_RDX;
  (ppVar1->prsnv).prsnvt.tokval = in_RCX;
  (ppVar1->prsnv).prsnvn[2] = in_R8;
  return ppVar1;
}

Assistant:

prsndef *prsnew3(prscxdef *ctx, int t, prsndef *n1, prsndef *n2, prsndef *n3)
{
    prsndef *n = prsalo(ctx, 3);
    
    n->prsntyp = t;
    n->prsnnlf = 3;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    n->prsnv.prsnvn[2] = n3;
    return(n);
}